

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

char * concat_url(char *base,char *relurl)

{
  char cVar1;
  CURLcode CVar2;
  char *sep;
  char *pcVar3;
  char *pcVar4;
  size_t len;
  char *pcVar5;
  char *pcVar6;
  _Bool relative;
  int iVar7;
  dynbuf newest;
  dynbuf dStack_48;
  
  pcVar3 = strstr(base,"//");
  pcVar5 = pcVar3 + 2;
  if (pcVar3 == (char *)0x0) {
    pcVar5 = base;
  }
  if (*relurl == '/') {
    if (relurl[1] == '/') {
      *pcVar5 = '\0';
      relurl = relurl + 2;
      relative = false;
    }
    else {
      pcVar3 = strchr(pcVar5,0x2f);
      pcVar4 = strchr(pcVar5,0x3f);
      if (pcVar3 == (char *)0x0) {
        relative = true;
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '\0';
        }
      }
      else {
        pcVar6 = pcVar3;
        if (pcVar4 < pcVar3) {
          pcVar6 = pcVar4;
        }
        if (pcVar4 == (char *)0x0) {
          pcVar6 = pcVar3;
        }
        *pcVar6 = '\0';
        relative = true;
      }
    }
  }
  else {
    pcVar3 = strchr(pcVar5,0x3f);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    if ((*relurl != '?') && (pcVar3 = strrchr(pcVar5,0x2f), pcVar3 != (char *)0x0)) {
      *pcVar3 = '\0';
    }
    pcVar3 = strchr(pcVar5,0x2f);
    pcVar5 = pcVar3 + 1;
    if (pcVar3 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    if (*relurl == '.') {
      relurl = relurl + (ulong)(relurl[1] == '/') * 2;
    }
    iVar7 = 0;
    if (*relurl == '.') {
      iVar7 = 0;
      pcVar4 = relurl;
      do {
        relurl = pcVar4;
        if ((pcVar4[1] != '.') || (pcVar4[2] != '/')) break;
        iVar7 = iVar7 + 1;
        relurl = pcVar4 + 3;
        pcVar6 = pcVar4 + 3;
        pcVar4 = relurl;
      } while (*pcVar6 == '.');
    }
    relative = true;
    if (iVar7 != 0 && pcVar3 != (char *)0x0) {
      do {
        pcVar3 = strrchr(pcVar5,0x2f);
        if (pcVar3 == (char *)0x0) {
          *pcVar5 = '\0';
          break;
        }
        *pcVar3 = '\0';
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
  }
  Curl_dyn_init(&dStack_48,8000000);
  CVar2 = Curl_dyn_add(&dStack_48,base);
  if (CVar2 == CURLE_OK) {
    cVar1 = *relurl;
    if (cVar1 != '/') {
      if (pcVar5 == (char *)0x0) {
        if (cVar1 != '?') goto LAB_005043d2;
      }
      else if ((cVar1 != '?') && (*pcVar5 != '\0')) {
LAB_005043d2:
        CVar2 = Curl_dyn_addn(&dStack_48,"/",1);
        if (CVar2 != CURLE_OK) goto LAB_0050437e;
      }
    }
    len = strlen(relurl);
    urlencode_str(&dStack_48,relurl,len,relative,false);
    pcVar5 = Curl_dyn_ptr(&dStack_48);
  }
  else {
LAB_0050437e:
    pcVar5 = (char *)0x0;
  }
  return pcVar5;
}

Assistant:

static char *concat_url(char *base, const char *relurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  struct dynbuf newest;
  char *protsep;
  char *pathsep;
  bool host_changed = FALSE;
  const char *useurl = relurl;

  /* protsep points to the start of the host name */
  protsep = strstr(base, "//");
  if(!protsep)
    protsep = base;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there's a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there's one
       available, or if the new URL is just a query string (starts with a
       '?')  we append the new one at the end of the entire currently worked
       out URL */
    if(useurl[0] != '?') {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;
    }

    /* Check if there's any slash after the host name, and if so, remember
       that position instead */
    pathsep = strchr(protsep, '/');
    if(pathsep)
      protsep = pathsep + 1;
    else
      protsep = NULL;

    /* now deal with one "./" or any amount of "../" in the newurl
       and act accordingly */

    if((useurl[0] == '.') && (useurl[1] == '/'))
      useurl += 2; /* just skip the "./" */

    while((useurl[0] == '.') &&
          (useurl[1] == '.') &&
          (useurl[2] == '/')) {
      level++;
      useurl += 3; /* pass the "../" */
    }

    if(protsep) {
      while(level--) {
        /* cut off one more level from the right of the original URL */
        pathsep = strrchr(protsep, '/');
        if(pathsep)
          *pathsep = 0;
        else {
          *protsep = 0;
          break;
        }
      }
    }
  }
  else {
    /* We got a new absolute path for this server */

    if(relurl[1] == '/') {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.url.com?dir=/home/daniel" we must not use the first
           slash, if there's a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.url.com?id=2380" which doesn't
           use a slash separator as it is supposed to, we need to check for a
           ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  Curl_dyn_init(&newest, CURL_MAX_INPUT_LENGTH);

  /* copy over the root url part */
  if(Curl_dyn_add(&newest, base))
    return NULL;

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || ('?' == useurl[0]))
    ;
  else {
    if(Curl_dyn_addn(&newest, "/", 1))
      return NULL;
  }

  /* then append the new piece on the right side */
  urlencode_str(&newest, useurl, strlen(useurl), !host_changed, FALSE);

  return Curl_dyn_ptr(&newest);
}